

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTessellationTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::single_tessellation_stage
               (NegativeTestContext *ctx)

{
  undefined *puVar1;
  bool bVar2;
  bool bVar3;
  ContextType ctxType;
  deUint32 dVar4;
  RenderContext *pRVar5;
  ContextInfo *this;
  mapped_type *pmVar6;
  char *pcVar7;
  ProgramSources *pPVar8;
  TestError *pTVar9;
  GLenum error;
  char *local_df8;
  allocator<char> local_de1;
  string local_de0;
  TestLog *local_dc0;
  TestLog *log_3;
  string local_db0;
  StringTemplate local_d90;
  string local_d70;
  allocator<char> local_d49;
  string local_d48;
  allocator<char> local_d21;
  string local_d20;
  StringTemplate local_d00;
  string local_ce0;
  allocator<char> local_cb9;
  string local_cb8;
  StringTemplate local_c98;
  string local_c78;
  ProgramSources local_c58;
  undefined1 local_b88 [8];
  ShaderProgram program_3;
  string local_ab0;
  allocator<char> local_a89;
  string local_a88;
  TestLog *local_a68;
  TestLog *log_2;
  string local_a58;
  StringTemplate local_a38;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  StringTemplate local_9a8;
  string local_988;
  allocator<char> local_961;
  string local_960;
  StringTemplate local_940;
  string local_920;
  ProgramSources local_900;
  undefined1 local_830 [8];
  ShaderProgram program_2;
  string local_758;
  TestLog *local_738;
  TestLog *log_1;
  string local_728;
  allocator<char> local_701;
  string local_700;
  StringTemplate local_6e0;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  StringTemplate local_678;
  string local_658;
  allocator<char> local_631;
  string local_630;
  StringTemplate local_610;
  string local_5f0;
  ProgramSources local_5d0;
  undefined1 local_500 [8];
  ShaderProgram program_1;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  TestLog *local_3b8;
  TestLog *log;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  StringTemplate local_360;
  string local_340;
  allocator<char> local_319;
  string local_318;
  StringTemplate local_2f8;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  StringTemplate local_290;
  string local_270;
  ProgramSources local_250;
  undefined1 local_180 [8];
  ShaderProgram program;
  key_type local_a8;
  allocator<char> local_81;
  key_type local_80;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  bool requireTES;
  bool isES32;
  NegativeTestContext *ctx_local;
  
  pRVar5 = NegativeTestContext::getRenderContext(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  this = NegativeTestContext::getContextInfo(ctx);
  bVar3 = glu::ContextInfo::isExtensionSupported(this,"GL_NV_gpu_shader5");
  args._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = (bVar3 ^ 0xffU) & 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  if (bVar2) {
    local_df8 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_df8 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"GLSL_VERSION_STRING",&local_81);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_80);
  std::__cxx11::string::operator=((string *)pmVar6,local_df8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pcVar7 = "#extension GL_EXT_tessellation_shader : require";
  if (bVar2) {
    pcVar7 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"GLSL_TESS_EXTENSION_STRING",
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_a8);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar7);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  checkTessellationSupport(ctx);
  pRVar5 = NegativeTestContext::getRenderContext(ctx);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,puVar1,&local_2b1);
  tcu::StringTemplate::StringTemplate(&local_290,&local_2b0);
  tcu::StringTemplate::specialize
            (&local_270,&local_290,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,puVar1,&local_319);
  tcu::StringTemplate::StringTemplate(&local_2f8,&local_318);
  tcu::StringTemplate::specialize
            (&local_2d8,&local_2f8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  puVar1 = tessControlShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,puVar1,&local_381);
  tcu::StringTemplate::StringTemplate(&local_360,&local_380);
  tcu::StringTemplate::specialize
            (&local_340,&local_360,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"",(allocator<char> *)((long)&log + 7));
  makeTessPipelineSources(&local_250,&local_270,&local_2d8,&local_340,&local_3a8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_180,pRVar5,&local_250);
  glu::ProgramSources::~ProgramSources(&local_250);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&log + 7));
  std::__cxx11::string::~string((string *)&local_340);
  tcu::StringTemplate::~StringTemplate(&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  std::__cxx11::string::~string((string *)&local_2d8);
  tcu::StringTemplate::~StringTemplate(&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string((string *)&local_270);
  tcu::StringTemplate::~StringTemplate(&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  local_3b8 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  glu::operator<<(local_3b8,(ShaderProgram *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,
             "A link error is generated if a non-separable program has a tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported."
             ,&local_3d9);
  NegativeTestContext::beginSection(ctx,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  if (((args._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) == 0) ||
     (bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_180), !bVar2)) {
    if (((args._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) == 0) &&
       (bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_180), !bVar2)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_428,"Program was expected to link",
                 (allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
      NegativeTestContext::fail(ctx,&local_428);
      std::__cxx11::string::~string((string *)&local_428);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"Program was not expected to link",&local_401);
    NegativeTestContext::fail(ctx,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
  }
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_180);
  pRVar5 = NegativeTestContext::getRenderContext(ctx);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,puVar1,&local_631);
  tcu::StringTemplate::StringTemplate(&local_610,&local_630);
  tcu::StringTemplate::specialize
            (&local_5f0,&local_610,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,puVar1,&local_699);
  tcu::StringTemplate::StringTemplate(&local_678,&local_698);
  tcu::StringTemplate::specialize
            (&local_658,&local_678,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  puVar1 = tessControlShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,puVar1,&local_701);
  tcu::StringTemplate::StringTemplate(&local_6e0,&local_700);
  tcu::StringTemplate::specialize
            (&local_6c0,&local_6e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"",(allocator<char> *)((long)&log_1 + 7));
  makeTessPipelineSources(&local_5d0,&local_5f0,&local_658,&local_6c0,&local_728);
  glu::ProgramSeparable::ProgramSeparable((ProgramSeparable *)((long)&log_1 + 6),true);
  pPVar8 = glu::ProgramSources::operator<<(&local_5d0,(ProgramSeparable *)((long)&log_1 + 6));
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_500,pRVar5,pPVar8);
  glu::ProgramSources::~ProgramSources(&local_5d0);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator((allocator<char> *)((long)&log_1 + 7));
  std::__cxx11::string::~string((string *)&local_6c0);
  tcu::StringTemplate::~StringTemplate(&local_6e0);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  std::__cxx11::string::~string((string *)&local_658);
  tcu::StringTemplate::~StringTemplate(&local_678);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  std::__cxx11::string::~string((string *)&local_5f0);
  tcu::StringTemplate::~StringTemplate(&local_610);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  local_738 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  glu::operator<<(local_738,(ShaderProgram *)local_500);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_500);
  if (!bVar2) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"failed to build program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTessellationTests.cpp"
               ,0x95);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_500);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,dVar4);
  NegativeTestContext::expectError(ctx,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,
             "GL_INVALID_OPERATION is generated if current program state has tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported."
             ,(allocator<char> *)((long)&program_2.m_program.m_info.linkTimeUs + 7));
  NegativeTestContext::beginSection(ctx,&local_758);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program_2.m_program.m_info.linkTimeUs + 7));
  glu::CallLogWrapper::glDrawArrays(&ctx->super_CallLogWrapper,0xe,0,3);
  error = 0;
  if ((args._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) != 0) {
    error = 0x502;
  }
  NegativeTestContext::expectError(ctx,error);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_500);
  pRVar5 = NegativeTestContext::getRenderContext(ctx);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,puVar1,&local_961);
  tcu::StringTemplate::StringTemplate(&local_940,&local_960);
  tcu::StringTemplate::specialize
            (&local_920,&local_940,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,puVar1,&local_9c9);
  tcu::StringTemplate::StringTemplate(&local_9a8,&local_9c8);
  tcu::StringTemplate::specialize
            (&local_988,&local_9a8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f0,"",&local_9f1);
  puVar1 = tessEvalShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a58,puVar1,(allocator<char> *)((long)&log_2 + 7));
  tcu::StringTemplate::StringTemplate(&local_a38,&local_a58);
  tcu::StringTemplate::specialize
            (&local_a18,&local_a38,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  makeTessPipelineSources(&local_900,&local_920,&local_988,&local_9f0,&local_a18);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_830,pRVar5,&local_900);
  glu::ProgramSources::~ProgramSources(&local_900);
  std::__cxx11::string::~string((string *)&local_a18);
  tcu::StringTemplate::~StringTemplate(&local_a38);
  std::__cxx11::string::~string((string *)&local_a58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&log_2 + 7));
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::__cxx11::string::~string((string *)&local_988);
  tcu::StringTemplate::~StringTemplate(&local_9a8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::__cxx11::string::~string((string *)&local_920);
  tcu::StringTemplate::~StringTemplate(&local_940);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  local_a68 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  glu::operator<<(local_a68,(ShaderProgram *)local_830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a88,
             "A link error is generated if a non-separable program has a tessellation evaluation shader but no tessellation control shader."
             ,&local_a89);
  NegativeTestContext::beginSection(ctx,&local_a88);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator(&local_a89);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_830);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ab0,"Program was not expected to link",
               (allocator<char> *)((long)&program_3.m_program.m_info.linkTimeUs + 7));
    NegativeTestContext::fail(ctx,&local_ab0);
    std::__cxx11::string::~string((string *)&local_ab0);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&program_3.m_program.m_info.linkTimeUs + 7));
  }
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_830);
  pRVar5 = NegativeTestContext::getRenderContext(ctx);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cb8,puVar1,&local_cb9);
  tcu::StringTemplate::StringTemplate(&local_c98,&local_cb8);
  tcu::StringTemplate::specialize
            (&local_c78,&local_c98,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d20,puVar1,&local_d21);
  tcu::StringTemplate::StringTemplate(&local_d00,&local_d20);
  tcu::StringTemplate::specialize
            (&local_ce0,&local_d00,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d48,"",&local_d49);
  puVar1 = tessEvalShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_db0,puVar1,(allocator<char> *)((long)&log_3 + 7));
  tcu::StringTemplate::StringTemplate(&local_d90,&local_db0);
  tcu::StringTemplate::specialize
            (&local_d70,&local_d90,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  makeTessPipelineSources(&local_c58,&local_c78,&local_ce0,&local_d48,&local_d70);
  glu::ProgramSeparable::ProgramSeparable((ProgramSeparable *)((long)&log_3 + 6),true);
  pPVar8 = glu::ProgramSources::operator<<(&local_c58,(ProgramSeparable *)((long)&log_3 + 6));
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_b88,pRVar5,pPVar8);
  glu::ProgramSources::~ProgramSources(&local_c58);
  std::__cxx11::string::~string((string *)&local_d70);
  tcu::StringTemplate::~StringTemplate(&local_d90);
  std::__cxx11::string::~string((string *)&local_db0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&log_3 + 7));
  std::__cxx11::string::~string((string *)&local_d48);
  std::allocator<char>::~allocator(&local_d49);
  std::__cxx11::string::~string((string *)&local_ce0);
  tcu::StringTemplate::~StringTemplate(&local_d00);
  std::__cxx11::string::~string((string *)&local_d20);
  std::allocator<char>::~allocator(&local_d21);
  std::__cxx11::string::~string((string *)&local_c78);
  tcu::StringTemplate::~StringTemplate(&local_c98);
  std::__cxx11::string::~string((string *)&local_cb8);
  std::allocator<char>::~allocator(&local_cb9);
  local_dc0 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  glu::operator<<(local_dc0,(ShaderProgram *)local_b88);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_b88);
  if (bVar2) {
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_b88);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,dVar4);
    NegativeTestContext::expectError(ctx,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_de0,
               "GL_INVALID_OPERATION is generated if current program state has tessellation evaluation shader but no tessellation control shader."
               ,&local_de1);
    NegativeTestContext::beginSection(ctx,&local_de0);
    std::__cxx11::string::~string((string *)&local_de0);
    std::allocator<char>::~allocator(&local_de1);
    glu::CallLogWrapper::glDrawArrays(&ctx->super_CallLogWrapper,0xe,0,3);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_b88);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
    return;
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,"failed to build program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTessellationTests.cpp"
             ,0xbe);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void single_tessellation_stage (NegativeTestContext& ctx)
{
	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const bool					requireTES = !ctx.getContextInfo().isExtensionSupported("GL_NV_gpu_shader5");
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	args["GLSL_TESS_EXTENSION_STRING"]	= isES32 ? "" : "#extension GL_EXT_tessellation_shader : require";

	checkTessellationSupport(ctx);

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   tcu::StringTemplate(tessControlShaderSource).specialize(args),
														   "")); // missing tessEvalShaderSource
		tcu::TestLog& log = ctx.getLog();
		log << program;

		ctx.beginSection("A link error is generated if a non-separable program has a tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported.");

		if (requireTES && program.isOk())
			ctx.fail("Program was not expected to link");
		else if (!requireTES && !program.isOk())
			ctx.fail("Program was expected to link");

		ctx.endSection();
	}

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   tcu::StringTemplate(tessControlShaderSource).specialize(args),
														   "") // missing tessEvalShaderSource
								   << glu::ProgramSeparable(true));
		tcu::TestLog& log = ctx.getLog();
		log << program;

		if (!program.isOk())
			TCU_THROW(TestError, "failed to build program");

		ctx.glUseProgram(program.getProgram());
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION is generated if current program state has tessellation control shader but no tessellation evaluation shader, unless GL_NV_gpu_shader5 is supported.");
		ctx.glDrawArrays(GL_PATCHES, 0, 3);
		ctx.expectError(requireTES ? GL_INVALID_OPERATION : GL_NO_ERROR);
		ctx.endSection();

		ctx.glUseProgram(0);
	}

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   "", // missing tessControlShaderSource
														   tcu::StringTemplate(tessEvalShaderSource).specialize(args)));
		tcu::TestLog& log = ctx.getLog();
		log << program;

		ctx.beginSection("A link error is generated if a non-separable program has a tessellation evaluation shader but no tessellation control shader.");

		if (program.isOk())
			ctx.fail("Program was not expected to link");

		ctx.endSection();
	}

	{
		glu::ShaderProgram program(ctx.getRenderContext(),
								   makeTessPipelineSources(tcu::StringTemplate(vertexShaderSource).specialize(args),
														   tcu::StringTemplate(fragmentShaderSource).specialize(args),
														   "", // missing tessControlShaderSource
														   tcu::StringTemplate(tessEvalShaderSource).specialize(args))
									<< glu::ProgramSeparable(true));
		tcu::TestLog& log = ctx.getLog();
		log << program;

		if (!program.isOk())
			TCU_THROW(TestError, "failed to build program");

		ctx.glUseProgram(program.getProgram());
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION is generated if current program state has tessellation evaluation shader but no tessellation control shader.");
		ctx.glDrawArrays(GL_PATCHES, 0, 3);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.glUseProgram(0);
	}
}